

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

SC_Cell * Abc_SclFindInvertor(SC_Lib *p,int fFindBuff)

{
  int iVar1;
  long lVar2;
  long lVar3;
  SC_Cell *pSVar4;
  uint uVar5;
  void *pvVar6;
  
  lVar3 = -0x5555555555555556;
  if (fFindBuff == 0) {
    lVar3 = 0x5555555555555555;
  }
  iVar1 = (p->vCellClasses).nSize;
  uVar5 = 0;
  if (iVar1 < 1) {
    pvVar6 = (void *)0x0;
  }
  else {
    do {
      pvVar6 = (p->vCellClasses).pArray[uVar5];
      if (*(int *)((long)pvVar6 + 0x40) == 1) {
        if (*(int *)((long)pvVar6 + 0x34) < 2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar2 = *(long *)(*(long *)((long)pvVar6 + 0x38) + 8);
        if (*(int *)(lVar2 + 0x34) < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        if (**(long **)(lVar2 + 0x38) == lVar3) break;
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < iVar1);
  }
  if (pvVar6 == (void *)0x0) {
    pSVar4 = (SC_Cell *)0x0;
  }
  else {
    pSVar4 = *(SC_Cell **)((long)pvVar6 + 0x58);
  }
  return pSVar4;
}

Assistant:

SC_Cell * Abc_SclFindInvertor( SC_Lib * p, int fFindBuff )
{
    SC_Cell * pCell = NULL;
    word Truth = fFindBuff ? ABC_CONST(0xAAAAAAAAAAAAAAAA) : ABC_CONST(0x5555555555555555);
    int k;
    SC_LibForEachCellClass( p, pCell, k )
        if ( pCell->n_inputs == 1 && Vec_WrdEntry(&SC_CellPin(pCell, 1)->vFunc, 0) == Truth )
            break;
    // take representative
    return pCell ? pCell->pRepr : NULL;
}